

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void install_signal_handlers(void)

{
  int *piVar1;
  char *pcVar2;
  
  old_sighup_handler = (SIGHANDLER_T)signal(1,(__sighandler_t)0x1);
  if (old_sighup_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    logmsg("cannot install SIGHUP handler: %s",pcVar2);
  }
  old_sigpipe_handler = (SIGHANDLER_T)signal(0xd,(__sighandler_t)0x1);
  if (old_sigpipe_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    logmsg("cannot install SIGPIPE handler: %s",pcVar2);
  }
  old_sigalrm_handler = (SIGHANDLER_T)signal(0xe,(__sighandler_t)0x1);
  if (old_sigalrm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    logmsg("cannot install SIGALRM handler: %s",pcVar2);
  }
  old_sigint_handler = (SIGHANDLER_T)signal(2,exit_signal_handler);
  if (old_sigint_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    logmsg("cannot install SIGINT handler: %s",pcVar2);
  }
  else {
    siginterrupt(2,1);
  }
  old_sigterm_handler = (SIGHANDLER_T)signal(0xf,exit_signal_handler);
  if (old_sigterm_handler == (SIGHANDLER_T)0xffffffffffffffff) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    logmsg("cannot install SIGTERM handler: %s",pcVar2);
  }
  else {
    siginterrupt(0xf,1);
  }
  return;
}

Assistant:

static void install_signal_handlers(void)
{
#ifdef SIGHUP
  /* ignore SIGHUP signal */
  old_sighup_handler = signal(SIGHUP, SIG_IGN);
  if(old_sighup_handler == SIG_ERR)
    logmsg("cannot install SIGHUP handler: %s", strerror(errno));
#endif
#ifdef SIGPIPE
  /* ignore SIGPIPE signal */
  old_sigpipe_handler = signal(SIGPIPE, SIG_IGN);
  if(old_sigpipe_handler == SIG_ERR)
    logmsg("cannot install SIGPIPE handler: %s", strerror(errno));
#endif
#ifdef SIGALRM
  /* ignore SIGALRM signal */
  old_sigalrm_handler = signal(SIGALRM, SIG_IGN);
  if(old_sigalrm_handler == SIG_ERR)
    logmsg("cannot install SIGALRM handler: %s", strerror(errno));
#endif
#ifdef SIGINT
  /* handle SIGINT signal with our exit_signal_handler */
  old_sigint_handler = signal(SIGINT, exit_signal_handler);
  if(old_sigint_handler == SIG_ERR)
    logmsg("cannot install SIGINT handler: %s", strerror(errno));
  else
    siginterrupt(SIGINT, 1);
#endif
#ifdef SIGTERM
  /* handle SIGTERM signal with our exit_signal_handler */
  old_sigterm_handler = signal(SIGTERM, exit_signal_handler);
  if(old_sigterm_handler == SIG_ERR)
    logmsg("cannot install SIGTERM handler: %s", strerror(errno));
  else
    siginterrupt(SIGTERM, 1);
#endif
#if defined(SIGBREAK) && defined(WIN32)
  /* handle SIGBREAK signal with our exit_signal_handler */
  old_sigbreak_handler = signal(SIGBREAK, exit_signal_handler);
  if(old_sigbreak_handler == SIG_ERR)
    logmsg("cannot install SIGBREAK handler: %s", strerror(errno));
  else
    siginterrupt(SIGBREAK, 1);
#endif
}